

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

EventLoop * kj::anon_unknown_54::currentEventLoop(void)

{
  long *in_FS_OFFSET;
  Fault local_18;
  Fault f;
  EventLoop *loop;
  
  f.exception = *(Exception **)(*in_FS_OFFSET + -0x10);
  if (f.exception != (Exception *)0x0) {
    return (EventLoop *)f.exception;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x33,FAILED,"loop != nullptr","\"No event loop is running on this thread.\"",
             (char (*) [41])"No event loop is running on this thread.");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

EventLoop& currentEventLoop() {
  EventLoop* loop = threadLocalEventLoop;
  KJ_REQUIRE(loop != nullptr, "No event loop is running on this thread.");
  return *loop;
}